

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall Reducer::visitModule(Reducer *this,Module *curr)

{
  uintptr_t uVar1;
  Expression *pEVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  pointer pMVar9;
  ostream *poVar10;
  reference this_00;
  type __x;
  size_type sVar11;
  int *piVar12;
  reference pvVar13;
  long lVar14;
  reference pEVar15;
  undefined8 *puVar16;
  unsigned_long *puVar17;
  iterator iVar18;
  iterator iVar19;
  reference this_01;
  pointer this_02;
  Expression **ppEVar20;
  Type params;
  Name NVar21;
  Name NVar22;
  Iterator IVar23;
  bool local_349;
  Signature local_278;
  HeapType local_268;
  BasicType local_25c;
  Expression *local_258;
  Expression *child;
  Self *local_248;
  Index local_240;
  undefined1 local_238 [8];
  Iterator __end3_1;
  undefined1 local_218 [8];
  Iterator __begin3_1;
  ChildIterator *__range3_1;
  Expression *funcBody;
  HeapType funcType;
  Function *func;
  unsigned_long uStack_188;
  bool allTablesEmpty;
  unsigned_long local_180 [2];
  ulong local_170;
  undefined8 uStack_168;
  Export exp_2;
  __normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
  local_130;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Export,_std::allocator<wasm::Export>_> *__range3;
  ProgramResult result;
  char *pcStack_c8;
  value_type exp_1;
  long local_98;
  size_t j;
  vector<wasm::Export,_std::allocator<wasm::Export>_> currExports;
  ulong local_70;
  size_t i;
  size_t skip;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  vector<wasm::Export,_std::allocator<wasm::Export>_> exports;
  Module *curr_local;
  Reducer *this_local;
  
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::get(&this->module);
  if (curr != pMVar9) {
    __assert_fail("curr == module.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp"
                  ,0x3d5,"void Reducer::visitModule(Module *)");
  }
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    bVar7 = reduceFunctions(this);
  } while (bVar7);
  shrinkElementSegments(this);
  poVar10 = std::operator<<((ostream *)&std::cerr,"|    try to remove exports (with factor ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->factor);
  std::operator<<(poVar10,")\n");
  std::vector<wasm::Export,_std::allocator<wasm::Export>_>::vector
            ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1);
  pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  __end1 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&pMVar9->exports);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end(&pMVar9->exports);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                     *)&exp), bVar7) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end1);
    __x = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator*(this_00);
    std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
              ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1,__x);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end1);
  }
  i = 1;
  for (local_70 = 0;
      sVar11 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                         ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1),
      local_70 < sVar11; local_70 = local_70 + 1) {
    currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = this->factor / 100 + 1;
    currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1000;
    piVar12 = std::max<int>((int *)((long)&currExports.
                                           super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            (int *)&currExports.
                                    super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar7 = shouldTryToReduce(this,(long)*piVar12);
    if (((bVar7 ^ 0xffU) & 1) == 0) {
      std::vector<wasm::Export,_std::allocator<wasm::Export>_>::vector
                ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
      local_98 = 0;
      while( true ) {
        sVar11 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                           ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        bVar7 = false;
        if (sVar11 < i) {
          sVar11 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                             ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1);
          bVar7 = local_70 + local_98 < sVar11;
        }
        if (!bVar7) break;
        pvVar13 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::operator[]
                            ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1,
                             local_70 + local_98);
        pcStack_c8 = *(char **)pvVar13;
        _exp_1 = *(undefined8 *)(pvVar13 + 8);
        pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                           (&this->module);
        NVar21.super_IString.str._M_str = pcStack_c8;
        NVar21.super_IString.str._M_len = (size_t)pMVar9;
        lVar14 = wasm::Module::getExportOrNull(NVar21);
        if (lVar14 != 0) {
          std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
                    ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j,
                     (value_type *)&pcStack_c8);
          pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                             (&this->module);
          result.time = (double)pcStack_c8;
          NVar22.super_IString.str._M_str = pcStack_c8;
          NVar22.super_IString.str._M_len = (size_t)pMVar9;
          wasm::Module::removeExport(NVar22);
        }
        local_98 = local_98 + 1;
      }
      ProgramResult::ProgramResult((ProgramResult *)&__range3);
      bVar7 = writeAndTestReduction(this,(ProgramResult *)&__range3);
      if (bVar7) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"|      removed ");
        sVar11 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                           ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar11);
        std::operator<<(poVar10," exports\n");
        sVar11 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::size
                           ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        noteReduction(this,sVar11);
        local_70 = i + local_70;
        local_180[0] = (unsigned_long)this->factor;
        uStack_188 = i << 1;
        puVar17 = std::min<unsigned_long>(local_180,&stack0xfffffffffffffe78);
        i = *puVar17;
      }
      else {
        __end3 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::begin
                           ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        local_130._M_current =
             (Export *)
             std::vector<wasm::Export,_std::allocator<wasm::Export>_>::end
                       ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
        while (bVar7 = __gnu_cxx::operator!=(&__end3,&local_130), bVar7) {
          pEVar15 = __gnu_cxx::
                    __normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
                    ::operator*(&__end3);
          uStack_168 = *(undefined8 *)pEVar15;
          _exp_2 = *(undefined8 *)(pEVar15 + 8);
          uVar3 = *(undefined8 *)(pEVar15 + 0x10);
          uVar4 = *(undefined8 *)(pEVar15 + 0x18);
          uVar5 = *(undefined8 *)(pEVar15 + 0x20);
          uVar6 = *(undefined8 *)(pEVar15 + 0x28);
          pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                             (&this->module);
          puVar16 = (undefined8 *)operator_new(0x30);
          puVar16[4] = uVar5;
          puVar16[5] = uVar6;
          puVar16[2] = uVar3;
          puVar16[3] = uVar4;
          *puVar16 = uStack_168;
          puVar16[1] = _exp_2;
          wasm::Module::addExport((Export *)pMVar9);
          __gnu_cxx::
          __normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
          ::operator++(&__end3);
        }
        local_170 = i >> 1;
        local_180[1] = 1;
        puVar17 = std::max<unsigned_long>(&local_170,local_180 + 1);
        i = *puVar17;
      }
      ProgramResult::~ProgramResult((ProgramResult *)&__range3);
      std::vector<wasm::Export,_std::allocator<wasm::Export>_>::~vector
                ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&j);
    }
  }
  pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  iVar18 = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::begin(&pMVar9->elementSegments);
  pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  iVar19 = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::end(&pMVar9->elementSegments);
  bVar7 = std::
          all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,Reducer::visitModule(wasm::Module*)::_lambda(auto:1&)_1_>
                    (iVar18._M_current,iVar19._M_current);
  pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  sVar11 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::size(&pMVar9->functions);
  if (sVar11 == 1) {
    pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                       (&this->module);
    bVar8 = std::
            vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ::empty(&pMVar9->exports);
    if ((bVar8) && (bVar7)) {
      pMVar9 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                         (&this->module);
      this_01 = std::
                vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ::operator[](&pMVar9->functions,0);
      this_02 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_01);
      bVar7 = wasm::Importable::imported(&this_02->super_Importable);
      if ((!bVar7) && (bVar7 = wasm::Properties::isNamedControlFlow(this_02->body), !bVar7)) {
        uVar1 = (this_02->type).id;
        pEVar2 = this_02->body;
        wasm::ChildIterator::ChildIterator((ChildIterator *)&__begin3_1.index,this_02->body);
        IVar23 = wasm::AbstractChildIterator<wasm::ChildIterator>::begin
                           ((AbstractChildIterator<wasm::ChildIterator> *)&__begin3_1.index);
        __end3_1._8_8_ = IVar23.parent;
        __begin3_1.parent._0_4_ = IVar23.index;
        local_218 = (undefined1  [8])__end3_1._8_8_;
        IVar23 = wasm::AbstractChildIterator<wasm::ChildIterator>::end
                           ((AbstractChildIterator<wasm::ChildIterator> *)&__begin3_1.index);
        local_248 = IVar23.parent;
        local_240 = IVar23.index;
        local_238 = (undefined1  [8])local_248;
        __end3_1.parent._0_4_ = local_240;
        while (bVar7 = wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                                 ((Iterator *)local_218,(Iterator *)local_238), bVar7) {
          ppEVar20 = wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                               ((Iterator *)local_218);
          local_258 = *ppEVar20;
          bVar7 = wasm::Type::isConcrete(&local_258->type);
          local_349 = true;
          if (!bVar7) {
            local_25c = none;
            local_349 = wasm::Type::operator==(&local_258->type,&local_25c);
          }
          if (((local_349 ^ 0xffU) & 1) == 0) {
            params.id = wasm::HeapType::getSignature();
            wasm::Signature::Signature(&local_278,params,(Type)(local_258->type).id);
            wasm::HeapType::HeapType(&local_268,local_278);
            (this_02->type).id = local_268.id;
            this_02->body = local_258;
            bVar7 = writeAndTestReduction(this);
            if (bVar7) {
              std::operator<<((ostream *)&std::cerr,"|    altered function result type\n");
              noteReduction(this,1);
              break;
            }
            (this_02->type).id = uVar1;
            this_02->body = pEVar2;
          }
          wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++
                    ((Iterator *)local_218);
        }
        child._4_4_ = 0xe;
        wasm::ChildIterator::~ChildIterator((ChildIterator *)&__begin3_1.index);
      }
    }
  }
  std::vector<wasm::Export,_std::allocator<wasm::Export>_>::~vector
            ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&__range1);
  return;
}

Assistant:

void visitModule(Module* curr) {
    // The initial module given to us is our global object. As we continue to
    // process things here, we may replace the module, so we should never again
    // refer to curr.
    assert(curr == module.get());
    curr = nullptr;

    // Reduction of entire functions at a time is very effective, and we do it
    // with exponential growth and backoff, so keep doing it while it works.
    while (reduceFunctions()) {
    }

    shrinkElementSegments();

    // try to remove exports
    std::cerr << "|    try to remove exports (with factor " << factor << ")\n";
    std::vector<Export> exports;
    for (auto& exp : module->exports) {
      exports.push_back(*exp);
    }
    size_t skip = 1;
    for (size_t i = 0; i < exports.size(); i++) {
      if (!shouldTryToReduce(std::max((factor / 100) + 1, 1000))) {
        continue;
      }
      std::vector<Export> currExports;
      for (size_t j = 0; currExports.size() < skip && i + j < exports.size();
           j++) {
        auto exp = exports[i + j];
        if (module->getExportOrNull(exp.name)) {
          currExports.push_back(exp);
          module->removeExport(exp.name);
        }
      }
      ProgramResult result;
      if (!writeAndTestReduction(result)) {
        for (auto exp : currExports) {
          module->addExport(new Export(exp));
        }
        skip = std::max(skip / 2, size_t(1)); // or 1?
      } else {
        std::cerr << "|      removed " << currExports.size() << " exports\n";
        noteReduction(currExports.size());
        i += skip;
        skip = std::min(size_t(factor), 2 * skip);
      }
    }
    // If we are left with a single function that is not exported or used in
    // a table, that is useful as then we can change the return type.
    bool allTablesEmpty =
      std::all_of(module->elementSegments.begin(),
                  module->elementSegments.end(),
                  [&](auto& segment) { return segment->data.empty(); });

    if (module->functions.size() == 1 && module->exports.empty() &&
        allTablesEmpty) {
      auto* func = module->functions[0].get();
      // We can't remove something that might have breaks to it.
      if (!func->imported() && !Properties::isNamedControlFlow(func->body)) {
        auto funcType = func->type;
        auto* funcBody = func->body;
        for (auto* child : ChildIterator(func->body)) {
          if (!(child->type.isConcrete() || child->type == Type::none)) {
            continue; // not something a function can return
          }
          // Try to replace the body with the child, fixing up the function
          // to accept it.
          func->type = Signature(funcType.getSignature().params, child->type);
          func->body = child;
          if (writeAndTestReduction()) {
            // great, we succeeded!
            std::cerr << "|    altered function result type\n";
            noteReduction(1);
            break;
          }
          // Undo.
          func->type = funcType;
          func->body = funcBody;
        }
      }
    }
  }